

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldBase::MapBegin(MapFieldBase *this,MapIterator *map_iter)

{
  undefined4 uVar1;
  NodeBase *pNVar2;
  MapFieldBase *this_00;
  
  this_00 = this;
  if (((this->super_MapFieldBaseForParse).payload_._M_i & 1) != 0) {
    (*MapFieldBaseForParse::sync_map_with_repeated)(this,0);
  }
  uVar1 = *(undefined4 *)&this[1].super_MapFieldBaseForParse.prototype_as_void_;
  if (uVar1 == *(undefined4 *)((long)&this[1].super_MapFieldBaseForParse.payload_._M_i + 4)) {
    uVar1 = 0;
    pNVar2 = (NodeBase *)0x0;
  }
  else {
    pNVar2 = *(NodeBase **)
              (this[2].super_MapFieldBaseForParse.payload_._M_i + (ulong)(uint)uVar1 * 8);
    if (pNVar2 == (NodeBase *)0x0) {
      protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  (map_iter->iter_).node_ = pNVar2;
  (map_iter->iter_).m_ = (UntypedMapBase *)(this + 1);
  (map_iter->iter_).bucket_index_ = uVar1;
  SetMapIteratorValue(this_00,map_iter);
  return;
}

Assistant:

void MapFieldBase::MapBegin(MapIterator* map_iter) const {
  map_iter->iter_ = GetMap().begin();
  SetMapIteratorValue(map_iter);
}